

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_randomize_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,
                     _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t sVar1;
  int iVar2;
  int local_74;
  int count;
  size_t p_size;
  mbedtls_mpi ll;
  mbedtls_mpi l;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_ecp_point *pt_local;
  mbedtls_ecp_group *grp_local;
  
  local_74 = 0;
  sVar1 = grp->pbits;
  mbedtls_mpi_init((mbedtls_mpi *)&ll.p);
  mbedtls_mpi_init((mbedtls_mpi *)&p_size);
  do {
    l.p._4_4_ = mbedtls_mpi_fill_random((mbedtls_mpi *)&ll.p,sVar1 + 7 >> 3,f_rng,p_rng);
    while( true ) {
      if (l.p._4_4_ != 0) goto LAB_00112725;
      iVar2 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&ll.p,&grp->P);
      if (iVar2 < 0) break;
      l.p._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&ll.p,1);
    }
    if (10 < local_74) {
      return -0x4d00;
    }
    iVar2 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&ll.p,1);
    local_74 = local_74 + 1;
  } while (iVar2 < 1);
  l.p._4_4_ = mbedtls_mpi_mul_mod(grp,&pt->Z,&pt->Z,(mbedtls_mpi *)&ll.p);
  if ((((l.p._4_4_ == 0) &&
       (l.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&p_size,(mbedtls_mpi *)&ll.p,
                                        (mbedtls_mpi *)&ll.p), l.p._4_4_ == 0)) &&
      (l.p._4_4_ = mbedtls_mpi_mul_mod(grp,&pt->X,&pt->X,(mbedtls_mpi *)&p_size), l.p._4_4_ == 0))
     && (l.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&p_size,(mbedtls_mpi *)&p_size,
                                         (mbedtls_mpi *)&ll.p), l.p._4_4_ == 0)) {
    l.p._4_4_ = mbedtls_mpi_mul_mod(grp,&pt->Y,&pt->Y,(mbedtls_mpi *)&p_size);
  }
LAB_00112725:
  mbedtls_mpi_free((mbedtls_mpi *)&ll.p);
  mbedtls_mpi_free((mbedtls_mpi *)&p_size);
  return l.p._4_4_;
}

Assistant:

static int ecp_randomize_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi l, ll;
    size_t p_size;
    int count = 0;

#if defined(MBEDTLS_ECP_RANDOMIZE_JAC_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_randomize_jac( grp, pt, f_rng, p_rng ) );
#endif /* MBEDTLS_ECP_RANDOMIZE_JAC_ALT */

    p_size = ( grp->pbits + 7 ) / 8;
    mbedtls_mpi_init( &l ); mbedtls_mpi_init( &ll );

    /* Generate l such that 1 < l < p */
    do
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &l, p_size, f_rng, p_rng ) );

        while( mbedtls_mpi_cmp_mpi( &l, &grp->P ) >= 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &l, 1 ) );

        if( count++ > 10 )
            return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
    }
    while( mbedtls_mpi_cmp_int( &l, 1 ) <= 0 );

    /* Z = l * Z */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &pt->Z,   &pt->Z,     &l  ) );

    /* X = l^2 * X */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &ll,      &l,         &l  ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &pt->X,   &pt->X,     &ll ) );

    /* Y = l^3 * Y */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &ll,      &ll,        &l  ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &pt->Y,   &pt->Y,     &ll ) );

cleanup:
    mbedtls_mpi_free( &l ); mbedtls_mpi_free( &ll );

    return( ret );
}